

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.cpp
# Opt level: O0

void __thiscall params::params(params *this,int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  invalid_argument *piVar5;
  long in_RDX;
  int in_ESI;
  int *in_RDI;
  ostringstream oss_1;
  exception *e;
  ostringstream oss;
  int capacity;
  int c;
  bool max_steps_specified;
  bool measurement_specified;
  _List_iterator<int> in_stack_fffffffffffffbc8;
  _List_iterator<int> in_stack_fffffffffffffbd0;
  int *in_stack_fffffffffffffbd8;
  list<int,_std::allocator<int>_> *in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffc50;
  string local_1d0 [32];
  ostringstream local_1b0 [396];
  int local_24;
  int local_20;
  byte local_1a;
  byte local_19;
  long local_18;
  int local_c;
  
  *in_RDI = 0;
  in_RDI[1] = 100;
  *(undefined1 *)(in_RDI + 2) = 0;
  local_18 = in_RDX;
  local_c = in_ESI;
  std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)0x10c3c0);
  local_19 = 0;
  local_1a = 0;
  do {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            local_20 = getopt_long(local_c,local_18,"a:m:s:h",params::long_options,0);
            if (local_20 == -1) {
              if (_optind < local_c) {
                std::__cxx11::ostringstream::ostringstream(local_1b0);
                std::operator<<((ostream *)local_1b0,"invalid argument: ");
                for (; _optind < local_c; _optind = _optind + 1) {
                  poVar4 = std::operator<<((ostream *)local_1b0,
                                           *(char **)(local_18 + (long)_optind * 8));
                  std::operator<<(poVar4,' ');
                }
                piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::__cxx11::ostringstream::str();
                std::invalid_argument::invalid_argument(piVar5,local_1d0);
                __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                            std::invalid_argument::~invalid_argument);
              }
              if ((*(byte *)(in_RDI + 2) & 1) == 0) {
                bVar1 = std::__cxx11::list<int,_std::allocator<int>_>::empty
                                  ((list<int,_std::allocator<int>_> *)(in_RDI + 4));
                if (bVar1) {
                  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
                  std::invalid_argument::invalid_argument(piVar5,"No buckets were added");
                  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                              std::invalid_argument::~invalid_argument);
                }
                std::__cxx11::list<int,_std::allocator<int>_>::begin
                          ((list<int,_std::allocator<int>_> *)in_stack_fffffffffffffbc8._M_node);
                std::__cxx11::list<int,_std::allocator<int>_>::end
                          ((list<int,_std::allocator<int>_> *)in_stack_fffffffffffffbc8._M_node);
                iVar3 = std::accumulate<std::_List_iterator<int>,int>
                                  (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,0);
                if (iVar3 < *in_RDI) {
                  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
                  std::invalid_argument::invalid_argument
                            (piVar5,"Required measurement exceeds total bucket capacity");
                  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                              std::invalid_argument::~invalid_argument);
                }
              }
              return;
            }
            if (local_20 == 0x3f) {
              piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(piVar5,"Invalid argument");
              __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            if (local_20 != 0x61) break;
            local_24 = anon_unknown.dwarf_bcb4::parse<int>(in_stack_fffffffffffffc50);
            if (local_24 < 1) {
              piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument
                        (piVar5,"Bucket capacity must be greater than 0");
              __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            std::__cxx11::list<int,std::allocator<int>>::emplace_back<int&>
                      (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
          }
          if (local_20 != 0x68) break;
          *(undefined1 *)(in_RDI + 2) = 1;
        }
        if (local_20 != 0x6d) break;
        if ((local_19 & 1) != 0) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar5,"Measurement was already specified");
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        local_19 = 1;
        iVar3 = anon_unknown.dwarf_bcb4::parse<int>(in_stack_fffffffffffffc50);
        *in_RDI = iVar3;
        if (*in_RDI < 1) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (piVar5,"Invalid measurement, must be greater than 0");
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
    } while (local_20 != 0x73);
    if ((local_1a & 1) != 0) {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar5,"Max number of steps already specified");
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    local_1a = 1;
    uVar2 = anon_unknown.dwarf_bcb4::parse<unsigned_int>(in_stack_fffffffffffffc50);
    in_RDI[1] = uVar2;
  } while (in_RDI[1] != 0);
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar5,"Invalid maximum number of steps");
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

params::params(const int argc, char* argv[])
{
	bool measurement_specified = false;
	bool max_steps_specified = false;

	while (true) {
		static option long_options[] = {
			{"add-bucket", true, nullptr, 'a'},
			{"measure", true, nullptr, 'm'},
			{"max-steps", true, nullptr, 's'},
			{"help", false, nullptr, 'h'},
			{nullptr, false, nullptr, 0}
		};

		int c = getopt_long(argc, argv, "a:m:s:h", long_options, nullptr);
		if (c == -1)
			break;

		switch (c) {
		case 'a' : {
			int capacity = parse<int>(optarg);
			if (capacity < 1)
				throw std::invalid_argument{
					"Bucket capacity must be greater than 0"};
			capacities.emplace_back(capacity);
			break;
		}
		case 'm' : {
			if (measurement_specified)
				throw std::invalid_argument{
					"Measurement was already specified"};
			measurement_specified = true;
			measure = parse<int>(optarg);
			if (measure < 1)
				throw std::invalid_argument{
					"Invalid measurement, must be greater than 0"};
			break;
		}
		case 's' : {
			if (max_steps_specified)
				throw std::invalid_argument{
					"Max number of steps already specified"};
			max_steps_specified = true;
			max_steps = parse<unsigned>(optarg);
			if (max_steps < 1)
				throw std::invalid_argument{
					"Invalid maximum number of steps"};
			break;
		}
		case 'h' :
			help_required = true;
			break;
		case '?' :
			throw std::invalid_argument{"Invalid argument"};
			break;
		}
	}

	if (optind < argc) {
		std::ostringstream oss;
		oss << "invalid argument: ";
		for (; optind < argc; ++optind)
			oss << argv[optind] << ' ';
		throw std::invalid_argument{oss.str()};
	}

	if (!help_required) {
		try {
			if (capacities.empty())
				throw std::invalid_argument{"No buckets were added"};
			if (std::accumulate(capacities.begin(), capacities.end(), 0) < measure)
				throw std::invalid_argument{
					"Required measurement exceeds total bucket capacity"};
		}
		catch (const std::exception& e) {
			help_required = true;
			std::ostringstream oss;
			oss << e.what() << "\n\n" << help;
			throw std::invalid_argument{oss.str()};
		}
	}
}